

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)8>_> *
vkt::wsi::anon_unknown_0::TriangleRenderer::createBuffer
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device,VkDeviceSize size,VkBufferUsageFlags usage)

{
  undefined1 local_68 [8];
  VkBufferCreateInfo bufferParams;
  VkBufferUsageFlags usage_local;
  VkDeviceSize size_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  
  local_68._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferParams._4_4_ = 0;
  bufferParams.pNext._0_4_ = 0;
  bufferParams.size._4_4_ = 0;
  bufferParams.usage = 0;
  bufferParams.queueFamilyIndexCount = 0;
  bufferParams._44_4_ = 0;
  bufferParams._16_8_ = size;
  bufferParams.size._0_4_ = usage;
  bufferParams.pQueueFamilyIndices._4_4_ = usage;
  ::vk::createBuffer(__return_storage_ptr__,vkd,device,(VkBufferCreateInfo *)local_68,
                     (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkBuffer> TriangleRenderer::createBuffer (const DeviceInterface&	vkd,
											   VkDevice					device,
											   VkDeviceSize				size,
											   VkBufferUsageFlags		usage)
{
	const VkBufferCreateInfo	bufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
		DE_NULL,
		(VkBufferCreateFlags)0,
		size,
		usage,
		VK_SHARING_MODE_EXCLUSIVE,
		0,
		DE_NULL
	};

	return vk::createBuffer(vkd, device, &bufferParams);
}